

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O3

int ecjpake_zkp_write(mbedtls_md_type_t md_type,mbedtls_ecp_group *grp,int pf,mbedtls_ecp_point *G,
                     mbedtls_mpi *x,mbedtls_ecp_point *X,char *id,uchar **p,uchar *end,
                     _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  short *X_00;
  uchar *puVar1;
  int iVar2;
  undefined1 local_a0 [8];
  mbedtls_ecp_point V;
  mbedtls_mpi v;
  undefined1 local_48 [8];
  mbedtls_mpi h;
  size_t len;
  
  iVar2 = -0x4f00;
  if (*p <= end) {
    mbedtls_ecp_point_init((mbedtls_ecp_point *)local_a0);
    X_00 = &V.Z.s;
    mbedtls_mpi_init((mbedtls_mpi *)X_00);
    mbedtls_mpi_init((mbedtls_mpi *)local_48);
    iVar2 = mbedtls_ecp_gen_keypair_base
                      (grp,G,(mbedtls_mpi *)X_00,(mbedtls_ecp_point *)local_a0,f_rng,p_rng);
    if (((((iVar2 == 0) &&
          (iVar2 = ecjpake_hash(md_type,grp,pf,G,(mbedtls_ecp_point *)local_a0,X,id,
                                (mbedtls_mpi *)local_48), iVar2 == 0)) &&
         (iVar2 = mbedtls_mpi_mul_mpi((mbedtls_mpi *)local_48,(mbedtls_mpi *)local_48,x), iVar2 == 0
         )) && ((iVar2 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)local_48,(mbedtls_mpi *)&V.Z.s,
                                             (mbedtls_mpi *)local_48), iVar2 == 0 &&
                (iVar2 = mbedtls_mpi_mod_mpi((mbedtls_mpi *)local_48,(mbedtls_mpi *)local_48,&grp->N
                                            ), iVar2 == 0)))) &&
       (iVar2 = mbedtls_ecp_tls_write_point
                          (grp,(mbedtls_ecp_point *)local_a0,pf,(size_t *)&h.s,*p,
                           (long)end - (long)*p), iVar2 == 0)) {
      *p = *p + h._8_8_;
      h._8_8_ = mbedtls_mpi_size((mbedtls_mpi *)local_48);
      puVar1 = *p;
      iVar2 = -0x4f00;
      if (((puVar1 <= end) && ((ulong)h._8_8_ < 0x100)) &&
         (h._8_8_ + 1 <= (ulong)((long)end - (long)puVar1))) {
        *p = puVar1 + 1;
        *puVar1 = (uchar)h._8_8_;
        iVar2 = mbedtls_mpi_write_binary((mbedtls_mpi *)local_48,*p,h._8_8_);
        if (iVar2 == 0) {
          *p = *p + h._8_8_;
          iVar2 = 0;
        }
      }
    }
    mbedtls_ecp_point_free((mbedtls_ecp_point *)local_a0);
    mbedtls_mpi_free((mbedtls_mpi *)&V.Z.s);
    mbedtls_mpi_free((mbedtls_mpi *)local_48);
  }
  return iVar2;
}

Assistant:

static int ecjpake_zkp_write(const mbedtls_md_type_t md_type,
                             const mbedtls_ecp_group *grp,
                             const int pf,
                             const mbedtls_ecp_point *G,
                             const mbedtls_mpi *x,
                             const mbedtls_ecp_point *X,
                             const char *id,
                             unsigned char **p,
                             const unsigned char *end,
                             int (*f_rng)(void *, unsigned char *, size_t),
                             void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_point V;
    mbedtls_mpi v;
    mbedtls_mpi h; /* later recycled to hold r */
    size_t len;

    if (end < *p) {
        return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
    }

    mbedtls_ecp_point_init(&V);
    mbedtls_mpi_init(&v);
    mbedtls_mpi_init(&h);

    /* Compute signature */
    MBEDTLS_MPI_CHK(mbedtls_ecp_gen_keypair_base((mbedtls_ecp_group *) grp,
                                                 G, &v, &V, f_rng, p_rng));
    MBEDTLS_MPI_CHK(ecjpake_hash(md_type, grp, pf, G, &V, X, id, &h));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&h, &h, x));     /* x*h */
    MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&h, &v, &h));     /* v - x*h */
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&h, &h, &grp->N));     /* r */

    /* Write it out */
    MBEDTLS_MPI_CHK(mbedtls_ecp_tls_write_point(grp, &V,
                                                pf, &len, *p, end - *p));
    *p += len;

    len = mbedtls_mpi_size(&h);   /* actually r */
    if (end < *p || (size_t) (end - *p) < 1 + len || len > 255) {
        ret = MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
        goto cleanup;
    }

    *(*p)++ = MBEDTLS_BYTE_0(len);
    MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&h, *p, len));     /* r */
    *p += len;

cleanup:
    mbedtls_ecp_point_free(&V);
    mbedtls_mpi_free(&v);
    mbedtls_mpi_free(&h);

    return ret;
}